

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learning.h
# Opt level: O2

double __thiscall
klogic::learning::
teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
::mse<SingleSquareError>
          (teacher<klogic::mlmvn,_klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_klogic::learning::learn_error<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>
           *this,SingleSquareError *sq_err)

{
  int iVar1;
  pointer sample;
  double dVar2;
  desired_type actual;
  double local_40;
  _Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_> local_38;
  
  sample = (this->_samples).
           super__Vector_base<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_40 = 0.0;
  for (; sample != (this->_samples).
                   super__Vector_base<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>,_std::allocator<klogic::learning::sample<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; sample = sample + 1) {
    mlmvn::output((cvector *)&local_38,this->learner,&sample->input);
    dVar2 = SingleSquareError::operator()(sq_err,sample,(cvector *)&local_38);
    local_40 = local_40 + dVar2;
    std::_Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>::~_Vector_base
              (&local_38);
  }
  iVar1 = samples_count(this);
  return local_40 / (double)iVar1;
}

Assistant:

double mse(SquareError const &sq_err = SquareError()) {
                double acc_error = 0.0;

                for (typename std::vector<Sample>::const_iterator i = _samples.begin();
                        i != _samples.end(); ++i) {

                    typename Sample::desired_type actual = learner.output(i->input);

                    acc_error += sq_err(*i, actual);
                }

                return acc_error / samples_count();
            }